

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O2

void duckdb::DiscreteAverageOperation::Finalize<long,duckdb::AvgState<duckdb::hugeint_t>>
               (AvgState<duckdb::hugeint_t> *state,long *target,AggregateFinalizeData *finalize_data
               )

{
  bool bVar1;
  long lVar2;
  hugeint_t hVar3;
  hugeint_t remainder;
  hugeint_t hStack_58;
  hugeint_t local_48;
  hugeint_t local_38;
  
  if (state->count != 0) {
    hVar3 = state->value;
    hugeint_t::hugeint_t(&local_48,state->count);
    hVar3 = Hugeint::DivMod(hVar3,local_48,&local_38);
    lVar2 = Hugeint::Cast<long>(hVar3);
    *target = lVar2;
    hugeint_t::hugeint_t(&hStack_58,state->count >> 1);
    bVar1 = hugeint_t::operator>(&local_38,&hStack_58);
    *target = *target + (ulong)bVar1;
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.count == 0) {
			finalize_data.ReturnNull();
		} else {
			hugeint_t remainder;
			target = Hugeint::Cast<T>(Hugeint::DivMod(state.value, state.count, remainder));
			// Round the result
			target += (remainder > (state.count / 2));
		}
	}